

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPrimitiveCoverage.cpp
# Opt level: O0

bool __thiscall
glcts::TessellationShaderPrimitiveCoverage::verifyDrawBufferContents
          (TessellationShaderPrimitiveCoverage *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar5;
  MessageBuilder local_1a8;
  undefined4 local_28;
  uchar local_24 [4];
  GLubyte rendered_result_ubyte [4];
  GLubyte expected_result_ubyte [4];
  GLuint n_pixel;
  bool result;
  Functions *gl;
  TessellationShaderPrimitiveCoverage *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x1218))(0x8ce0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glReadBuffer() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x2a9);
  (**(code **)(lVar4 + 0x1220))(0,0,0x800,0x800,0x1908,0x1401,this->m_rendered_data_buffer);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glReadPixels() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x2b0);
  rendered_result_ubyte[0] = '\0';
  rendered_result_ubyte[1] = '\0';
  rendered_result_ubyte[2] = '\0';
  rendered_result_ubyte[3] = '\0';
  while( true ) {
    if (0x3fffff < (uint)rendered_result_ubyte) {
      return true;
    }
    local_24[0] = 0xff;
    local_24[1] = 0x80;
    local_24[2] = '@';
    local_24[3] = ' ';
    local_28 = CONCAT13(this->m_rendered_data_buffer[(int)rendered_result_ubyte + 3],
                        CONCAT12(this->m_rendered_data_buffer[(int)rendered_result_ubyte + 2],
                                 CONCAT11(this->m_rendered_data_buffer
                                          [(int)rendered_result_ubyte + 1],
                                          this->m_rendered_data_buffer[(uint)rendered_result_ubyte])
                                ));
    if (local_28 != 0x204080ff) break;
    rendered_result_ubyte = (GLubyte  [4])((int)rendered_result_ubyte + 4);
  }
  this_00 = tcu::TestContext::getLog
                      ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [26])"Rendered pixel at index (");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)rendered_result_ubyte);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [13])") of value (");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uchar *)&local_28);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uchar *)((long)&local_28 + 1));
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uchar *)((long)&local_28 + 2));
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uchar *)((long)&local_28 + 3));
  pMVar5 = tcu::MessageBuilder::operator<<
                     (pMVar5,(char (*) [34])") does not match expected pixel (");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_24);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_24 + 1);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_24 + 2);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_24 + 3);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2a85ff4);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  return false;
}

Assistant:

bool TessellationShaderPrimitiveCoverage::verifyDrawBufferContents(void)
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetch the data */
	gl.readBuffer(GL_COLOR_ATTACHMENT0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadBuffer() failed");

	gl.readPixels(0,						  /* x */
				  0,						  /* y */
				  m_height, m_width, GL_RGBA, /* format */
				  GL_UNSIGNED_BYTE,			  /* type */
				  m_rendered_data_buffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() failed");

	/* Verify result data */
	bool result = true;

	for (glw::GLuint n_pixel = 0; n_pixel < (m_rendered_data_buffer_size >> 2); n_pixel += m_n_components)
	{
		glw::GLubyte expected_result_ubyte[] = { (glw::GLubyte)(m_clear_color[0] * 255.0f),
												 (glw::GLubyte)(m_clear_color[1] * 255.0f),
												 (glw::GLubyte)(m_clear_color[2] * 255.0f),
												 (glw::GLubyte)(m_clear_color[3] * 255.0f) };
		glw::GLubyte rendered_result_ubyte[] = { m_rendered_data_buffer[n_pixel + 0],
												 m_rendered_data_buffer[n_pixel + 1],
												 m_rendered_data_buffer[n_pixel + 2],
												 m_rendered_data_buffer[n_pixel + 3] };

		if (memcmp(expected_result_ubyte, rendered_result_ubyte, sizeof(rendered_result_ubyte)) != 0)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Rendered pixel at index (" << n_pixel << ") of value"
																									 " ("
							   << rendered_result_ubyte[0] << ", " << rendered_result_ubyte[1] << ", "
							   << rendered_result_ubyte[2] << ", " << rendered_result_ubyte[3]
							   << ") does not match expected pixel"
								  " ("
							   << expected_result_ubyte[0] << ", " << expected_result_ubyte[1] << ", "
							   << expected_result_ubyte[2] << ", " << expected_result_ubyte[3] << ")"
							   << tcu::TestLog::EndMessage;

			result = false;

			break;
		} /* if (rendered pixel is invalid) */
	}	 /* for (all pixels) */

	return result;
}